

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_package_end(dill_stream s)

{
  dill_stream in_RDI;
  dill_stream in_stack_00000010;
  
  x86_64_proc_ret(s);
  x86_64_branch_link(in_RDI);
  x86_64_emit_save(in_stack_00000010);
  x86_64_flush(in_RDI->p->code_base,in_RDI->p->code_limit);
  return;
}

Assistant:

extern void
x86_64_package_end(dill_stream s)
{
    x86_64_proc_ret(s);
    x86_64_branch_link(s);
    x86_64_emit_save(s);
    x86_64_flush(s->p->code_base, s->p->code_limit);
}